

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::mat4::homogeneous::from_mat3(mat4 *__return_storage_ptr__,mat3 *m)

{
  float_t m00;
  float_t m01;
  float_t m02;
  float_t m10;
  float_t m11;
  float_t m12;
  float_t m20;
  float_t m21;
  vec3 *pvVar1;
  float_t *pfVar2;
  mat3 *m_local;
  
  pvVar1 = mat3::operator[](m,0);
  pfVar2 = vec3::operator[](pvVar1,0);
  m00 = *pfVar2;
  pvVar1 = mat3::operator[](m,0);
  pfVar2 = vec3::operator[](pvVar1,1);
  m01 = *pfVar2;
  pvVar1 = mat3::operator[](m,0);
  pfVar2 = vec3::operator[](pvVar1,2);
  m02 = *pfVar2;
  pvVar1 = mat3::operator[](m,1);
  pfVar2 = vec3::operator[](pvVar1,0);
  m10 = *pfVar2;
  pvVar1 = mat3::operator[](m,1);
  pfVar2 = vec3::operator[](pvVar1,1);
  m11 = *pfVar2;
  pvVar1 = mat3::operator[](m,1);
  pfVar2 = vec3::operator[](pvVar1,2);
  m12 = *pfVar2;
  pvVar1 = mat3::operator[](m,2);
  pfVar2 = vec3::operator[](pvVar1,0);
  m20 = *pfVar2;
  pvVar1 = mat3::operator[](m,2);
  pfVar2 = vec3::operator[](pvVar1,1);
  m21 = *pfVar2;
  pvVar1 = mat3::operator[](m,2);
  pfVar2 = vec3::operator[](pvVar1,2);
  mat4(__return_storage_ptr__,m00,m01,m02,0.0,m10,m11,m12,0.0,m20,m21,*pfVar2,0.0,0.0,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4::homogeneous::from_mat3(const mat3& m)
{
    return mat4(M00(m), M01(m), M02(m), 0,
                M10(m), M11(m), M12(m), 0,
                M20(m), M21(m), M22(m), 0,
                0     , 0     , 0     , 1);
}